

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_exception.cpp
# Opt level: O3

void __thiscall
BmsParseInvalidRandomValueException::BmsParseInvalidRandomValueException
          (BmsParseInvalidRandomValueException *this,uint line,string *key,string *value)

{
  pointer pcVar1;
  
  (this->super_BmsParseException).line_ = line;
  (this->super_BmsParseException).super_BmsException._vptr_BmsException =
       (_func_int **)&PTR_Message_abi_cxx11__00143d40;
  (this->key_)._M_dataplus._M_p = (pointer)&(this->key_).field_2;
  pcVar1 = (key->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->key_,pcVar1,pcVar1 + key->_M_string_length);
  (this->value_)._M_dataplus._M_p = (pointer)&(this->value_).field_2;
  pcVar1 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->value_,pcVar1,pcVar1 + value->_M_string_length);
  return;
}

Assistant:

BmsParseInvalidRandomValueException::BmsParseInvalidRandomValueException( unsigned int line,
                                                                          const std::string& key,
                                                                          const std::string& value ) :
BmsParseException( line ),
key_( key ),
value_( value )
{
}